

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

bool __thiscall llvm::yaml::isBool(yaml *this,StringRef S)

{
  bool bVar1;
  
  if (S.Data == (char *)0x5) {
    bVar1 = true;
    if ((this[4] != (yaml)0x65 || *(int *)this != 0x736c6166) &&
       (this[4] != (yaml)0x65 || *(int *)this != 0x736c6146)) {
      bVar1 = this[4] == (yaml)0x45 && *(int *)this == 0x534c4146;
    }
  }
  else if ((S.Data != (char *)0x4) ||
          (((bVar1 = true, *(int *)this != 0x65757274 && (*(int *)this != 0x65757254)) &&
           (*(int *)this != 0x45555254)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool isBool(StringRef S) {
  return S.equals("true") || S.equals("True") || S.equals("TRUE") ||
         S.equals("false") || S.equals("False") || S.equals("FALSE");
}